

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O2

ALLEGRO_BITMAP ** reserve_local_bitmap(char *name,BmpType bmp_type)

{
  Bitmap *pBVar1;
  long lVar2;
  ALLEGRO_USTR *pAVar3;
  Bitmap *pBVar4;
  
  lVar2 = (long)num_global_bitmaps + -1;
  pBVar1 = bitmaps + num_global_bitmaps;
  do {
    pBVar4 = pBVar1;
    lVar2 = lVar2 + 1;
    if (0x7f < lVar2) {
      fatal_error("bitmap limit reached");
    }
    pBVar1 = pBVar4 + 1;
  } while (pBVar4->name != (ALLEGRO_USTR *)0x0);
  pAVar3 = (ALLEGRO_USTR *)al_ustr_new();
  pBVar4->name = pAVar3;
  return pBVar4[1].bitmap + ((ulong)bmp_type - 3);
}

Assistant:

static ALLEGRO_BITMAP **reserve_local_bitmap(const char *name, BmpType bmp_type)
{
   int i;

   for (i = num_global_bitmaps; i < MAX_BITMAPS; i++) {
      if (!bitmaps[i].name) {
         bitmaps[i].name = al_ustr_new(name);
         return &bitmaps[i].bitmap[bmp_type];
      }
   }

   fatal_error("bitmap limit reached");
   return NULL;
}